

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O2

rfc5444_result
rfc5444_writer_create_message
          (rfc5444_writer *writer,uint8_t msgid,uint8_t addr_len,rfc5444_writer_targetselector useIf
          ,void *param)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  ulong uVar7;
  list_entity **pplVar8;
  rfc5444_writer *writer_00;
  rfc5444_writer_address *prVar9;
  _Bool _Var10;
  char cVar11;
  rfc5444_result rVar12;
  int iVar13;
  int iVar14;
  rfc5444_writer_target *prVar15;
  ulong uVar16;
  list_entity *plVar17;
  list_entity *plVar18;
  list_entity *plVar19;
  avl_node *paVar20;
  undefined1 uVar21;
  int iVar22;
  list_entity *plVar23;
  int *piVar24;
  rfc5444_writer_address *last_addr;
  rfc5444_writer_address *last_addr_00;
  rfc5444_writer_message *msg;
  list_entity *plVar25;
  size_t sVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  list_entity *plVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  uint8_t msgid_local;
  rfc5444_writer_message *local_268;
  int local_25c;
  rfc5444_writer *local_258;
  size_t local_250;
  undefined4 local_248;
  int local_244;
  list_entity current_list;
  list_entity **local_208;
  ulong local_1e8;
  rfc5444_writer_address *local_1c8;
  void *local_1c0;
  _rfc5444_internal_addr_compress_session acs [16];
  
  msgid_local = msgid;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x86,
                  "enum rfc5444_result rfc5444_writer_create_message(struct rfc5444_writer *, uint8_t, uint8_t, rfc5444_writer_targetselector, void *)"
                 );
  }
  plVar30 = &writer->_targets;
  if (((writer->_targets).next != plVar30) || ((writer->_targets).prev != plVar30)) {
    local_268 = (rfc5444_writer_message *)avl_find(&writer->_msgcreators,&msgid_local);
    if (local_268 == (rfc5444_writer_message *)0x0) {
      return RFC5444_NO_MSGCREATOR;
    }
    if (local_268->target_specific == true) {
      prVar15 = (rfc5444_writer_target *)param;
      if (useIf != rfc5444_writer_singletarget_selector) {
        do {
          plVar30 = plVar30->next;
          if (plVar30->prev == (writer->_targets).prev) {
            return RFC5444_OKAY;
          }
          _Var10 = (*useIf)(writer,(rfc5444_writer_target *)(plVar30 + -3),param);
        } while ((!_Var10) ||
                (rVar12 = rfc5444_writer_create_message
                                    (writer,msgid_local,addr_len,
                                     rfc5444_writer_singletarget_selector,
                                     (rfc5444_writer_target *)(plVar30 + -3)),
                rVar12 == RFC5444_OKAY));
        return rVar12;
      }
    }
    else {
      prVar15 = (rfc5444_writer_target *)0x0;
    }
    writer->msg_target = prVar15;
    writer->msg_addr_len = addr_len;
    plVar23 = &(writer->_processors).list_head;
    lVar32 = 0;
    while (plVar23 = ((list_entity *)&plVar23->next)->next,
          plVar23->prev != (writer->_processors).list_head.prev) {
      cVar11 = (*(code *)plVar23[4].next)(plVar23,local_268->type);
      if (cVar11 != '\0') {
        lVar32 = lVar32 + (ulong)*(ushort *)((long)&plVar23[3].prev + 4);
      }
    }
    local_250 = writer->msg_size;
    while (plVar30 = plVar30->next, plVar30->prev != (writer->_targets).prev) {
      _Var10 = (*useIf)(writer,(rfc5444_writer_target *)(plVar30 + -3),param);
      if (_Var10) {
        if (*(char *)&plVar30[1].next == '\x01') {
          _rfc5444_writer_begin_packet(writer,(rfc5444_writer_target *)(plVar30 + -3));
        }
        uVar16 = (long)plVar30[-3].prev -
                 ((long)&(plVar30[2].prev)->next +
                 (long)&(plVar30[3].next)->next + (long)&(plVar30[2].next)->next + lVar32);
        if (uVar16 < local_250) {
          local_250 = uVar16;
        }
      }
    }
    _rfc5444_tlv_writer_init(&writer->_msg,local_250,writer->msg_size);
    msg = local_268;
    writer->_state = RFC5444_WRITER_ADD_HEADER;
    rfc5444_writer_set_msg_header(writer,local_268,false,false,false,false);
    if ((msg->addMessageHeader == (_func_int_rfc5444_writer_ptr_rfc5444_writer_message_ptr *)0x0) ||
       (iVar13 = (*msg->addMessageHeader)(writer,msg), msg = local_268, iVar13 == 0)) {
      writer->_state = RFC5444_WRITER_ADD_MSGTLV;
      plVar30 = &(msg->_provider_tree).list_head;
      plVar23 = plVar30;
      while (plVar23 = ((list_entity *)&plVar23->next)->next,
            plVar23->prev != (msg->_provider_tree).list_head.prev) {
        if ((plVar23 + -3)[1].prev != (list_entity *)0x0) {
          (*(code *)(plVar23 + -3)[1].prev)(writer);
          msg = local_268;
        }
      }
      writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
      while (plVar30 = ((list_entity *)&plVar30->next)->next,
            plVar30->prev != (msg->_provider_tree).list_head.prev) {
        if ((plVar30 + -3)[2].next != (list_entity *)0x0) {
          (*(code *)(plVar30 + -3)[2].next)(writer);
          msg = local_268;
        }
      }
      plVar30 = &msg->_addr_head;
      plVar23 = &msg->_non_mandatory_addr_head;
      plVar5 = (msg->_non_mandatory_addr_head).next;
      if ((plVar5 != plVar23) || ((msg->_non_mandatory_addr_head).prev != plVar23)) {
        ((local_268->_addr_head).prev)->next = plVar5;
        ((local_268->_non_mandatory_addr_head).next)->prev = (local_268->_addr_head).prev;
        plVar5 = (local_268->_non_mandatory_addr_head).prev;
        (local_268->_addr_head).prev = plVar5;
        plVar5->next = plVar30;
        (local_268->_non_mandatory_addr_head).prev = plVar23;
        (local_268->_non_mandatory_addr_head).next = plVar23;
        msg = local_268;
      }
      current_list.next = &current_list;
      plVar23 = plVar30->next;
      if ((plVar23 != plVar30) || ((msg->_addr_head).prev != plVar30)) {
        plVar17 = &msg->_msgspecific_tlvtype_head;
        plVar5 = &writer->_addr_tlvtype_head;
        local_250 = (size_t)(((int)local_250 -
                             ((int)(writer->_msg).header + (int)(writer->_msg).allocated +
                             (int)(writer->_msg).added)) + 1);
        iVar13 = 0;
        local_248 = (undefined4)CONCAT71((int7)((ulong)plVar5 >> 8),1);
        local_244 = 0;
        local_25c = 0;
        local_208 = (list_entity **)0x0;
        local_1c0 = param;
        last_addr = (rfc5444_writer_address *)0x0;
        local_258 = writer;
LAB_0014ba90:
        current_list.next = &current_list;
        bVar33 = true;
        current_list.prev = current_list.next;
        do {
          while( true ) {
            writer = local_258;
            if (plVar23 == plVar30) {
              if (last_addr != (rfc5444_writer_address *)0x0) {
                _close_addrblock(acs,local_258,last_addr,0);
                _finalize_message_fragment
                          (writer,local_268,&current_list,(_Bool)((byte)local_248 & 1),useIf,param);
                msg = local_268;
              }
              _rfc5444_writer_free_addresses(writer,msg);
              goto LAB_0014c03b;
            }
            if ((*(char *)((long)&plVar23[9].prev + 1) != '\x01') ||
               (*(char *)&plVar23[9].prev != '\0')) break;
            plVar23 = plVar23->next;
          }
          local_1c8 = last_addr;
          last_addr = (rfc5444_writer_address *)&plVar23[-2].prev;
          plVar18 = plVar17;
          if (bVar33) {
            while (plVar18 = plVar18->next, plVar19 = plVar5,
                  plVar18->prev != (msg->_msgspecific_tlvtype_head).prev) {
              *(undefined8 *)((long)&plVar18[5].prev + 4) = 0;
              *(undefined8 *)((long)&plVar18[6].next + 4) = 0;
              *(undefined8 *)((long)&plVar18[4].prev + 4) = 0;
              *(undefined8 *)((long)&plVar18[5].next + 4) = 0;
              *(undefined8 *)((long)&plVar18[3].prev + 4) = 0;
              *(undefined8 *)((long)&plVar18[4].next + 4) = 0;
              *(undefined8 *)((long)&plVar18[2].prev + 4) = 0;
              *(undefined8 *)((long)&plVar18[3].next + 4) = 0;
              *(undefined8 *)((long)&plVar18[1].prev + 4) = 0;
              *(undefined8 *)((long)&plVar18[2].next + 4) = 0;
            }
            while (plVar19 = plVar19->next, plVar19->prev != (local_258->_addr_tlvtype_head).prev) {
              *(undefined8 *)((long)&plVar19[5].prev + 4) = 0;
              *(undefined8 *)((long)&plVar19[6].next + 4) = 0;
              *(undefined8 *)((long)&plVar19[4].prev + 4) = 0;
              *(undefined8 *)((long)&plVar19[5].next + 4) = 0;
              *(undefined8 *)((long)&plVar19[3].prev + 4) = 0;
              *(undefined8 *)((long)&plVar19[4].next + 4) = 0;
              *(undefined8 *)((long)&plVar19[2].prev + 4) = 0;
              *(undefined8 *)((long)&plVar19[3].next + 4) = 0;
              *(undefined8 *)((long)&plVar19[1].prev + 4) = 0;
              *(undefined8 *)((long)&plVar19[2].next + 4) = 0;
            }
            memset(acs,0,0x180);
            local_25c = 1;
            local_208 = (list_entity **)last_addr;
          }
          *(int *)&plVar23[-2].prev = local_244;
          plVar23[1].next = &current_list;
          plVar23[1].prev = current_list.prev;
          pplVar8 = &(current_list.prev)->next;
          current_list.prev = plVar23 + 1;
          *pplVar8 = plVar23 + 1;
          plVar18 = current_list.prev;
          if (current_list.next == current_list.prev) {
            last_addr_00 = (rfc5444_writer_address *)0x0;
          }
          else {
            last_addr_00 = (rfc5444_writer_address *)&(current_list.prev)->prev[-3].prev;
          }
          bVar1 = local_258->msg_addr_len;
          uVar16 = (ulong)bVar1;
          bVar2 = *(byte *)((long)&current_list.prev[-2].prev + 5);
          if (last_addr_00 == (rfc5444_writer_address *)0x0) {
            local_1e8 = 0;
          }
          else {
            local_25c = local_25c + 1;
            if ((last_addr_00->address)._prefix_len != bVar2) {
              local_25c = 1;
            }
            for (uVar28 = 0;
                (local_1e8 = uVar16, uVar16 != uVar28 &&
                (local_1e8 = uVar28,
                (last_addr_00->address)._addr[uVar28] ==
                *(uint8_t *)((long)current_list.prev + (uVar28 - 0x24)))); uVar28 = uVar28 + 1) {
            }
            _close_addrblock(acs,local_258,last_addr_00,(int)local_1e8);
            local_1e8 = local_1e8 & 0xffffffff;
          }
          local_244 = local_244 + 1;
          pplVar8 = &plVar18[4].prev;
          plVar19 = (list_entity *)pplVar8;
          while( true ) {
            param = local_1c0;
            prVar9 = local_1c8;
            writer_00 = local_258;
            plVar19 = plVar19->next;
            plVar25 = plVar19->prev;
            if (plVar25 == plVar18[5].next) break;
            *(undefined2 *)&plVar19[5].next = 0;
            if (((last_addr_00 != (rfc5444_writer_address *)0x0) &&
                (paVar20 = avl_find(&last_addr_00->_addrtlv_tree,plVar19[-1].prev + 2),
                paVar20 != (avl_node *)0x0)) &&
               (uVar4 = *(ushort *)&paVar20[1].list.prev, uVar4 == *(ushort *)&plVar19[4].next)) {
              *(undefined1 *)((long)&plVar19[5].next + 1) = 1;
              iVar14 = bcmp(plVar19[4].prev,paVar20[1].parent,(ulong)uVar4);
              *(bool *)&plVar19[5].next = iVar14 == 0;
            }
          }
          for (uVar28 = 0; uVar28 != uVar16; uVar28 = uVar28 + 1) {
            bVar34 = last_addr_00 == (rfc5444_writer_address *)0x0;
            bVar33 = local_1e8 < uVar28;
            bVar3 = local_258->msg_addr_len;
            iVar14 = 0;
            if (!bVar33 && !bVar34) {
              iVar14 = (uint)bVar3 - (int)uVar28;
              if (acs[uVar28].multiplen == true) {
                iVar14 = iVar14 + 1;
              }
              else if (local_25c == 1) {
                iVar14 = ((iVar14 + (acs[uVar28].ptr)->index) - *(int *)&plVar18[-3].prev) + 1;
                acs[uVar28].multiplen = true;
              }
            }
            iVar27 = (3 - (uint)(uVar28 == 0)) + ((uint)bVar1 * 8 == (uint)bVar2 ^ 3) + (uint)bVar3;
            plVar19 = (list_entity *)pplVar8;
LAB_0014bd58:
            while (plVar19 = plVar19->next, plVar19->prev != plVar25) {
              plVar6 = plVar19[-1].prev;
              iVar31 = 5 - (uint)(*(char *)((long)&plVar6->next + 1) == '\0');
              uVar4 = *(ushort *)&plVar19[4].next;
              uVar29 = (uint)uVar4;
              iVar22 = (iVar31 - (uint)(uVar4 < 0x100)) + 2;
              if (uVar4 == 0) {
                iVar22 = iVar31;
              }
              iVar22 = iVar22 + (uint)uVar4;
              iVar27 = iVar27 + iVar22;
              if ((!bVar33 && !bVar34) && (*(char *)((long)&plVar19[5].next + 1) != '\0')) {
                if (*(char *)((long)&plVar6[6].next + uVar28 + 4) != '\x01') goto code_r0x0014bda6;
                goto LAB_0014bdb3;
              }
              iVar14 = iVar14 + iVar22;
            }
            plVar19 = (list_entity *)pplVar8;
            if ((bVar33 || bVar34) ||
               (*(int *)(&local_1c8 + uVar16 * 3) + iVar27 < acs[uVar28].total + iVar14)) {
              acs[uVar28].ptr = (rfc5444_writer_address *)&plVar18[-3].prev;
              acs[uVar28].multiplen = false;
              acs[uVar28].total = *(int *)(&local_1c8 + uVar16 * 3);
              acs[uVar28].current = iVar27;
              _Var10 = true;
              if (last_addr_00 != (rfc5444_writer_address *)0x0) goto LAB_0014be26;
            }
            else {
              acs[uVar28].current = iVar14;
              _Var10 = false;
LAB_0014be26:
              acs[uVar28].closed = _Var10;
            }
            while (plVar19 = plVar19->next, plVar19->prev != plVar25) {
              plVar25 = plVar19[-1].prev;
              if ((_Var10 == false) && (*(char *)((long)&plVar19[5].next + 1) != '\0')) {
                piVar24 = (int *)((long)&plVar25[2].next + uVar28 * 4 + 4);
                *piVar24 = *piVar24 + 1;
                uVar21 = 1;
                if (*(char *)&plVar19[5].next == '\0') goto LAB_0014be6c;
              }
              else {
                *(undefined4 *)((long)&plVar25[2].next + uVar28 * 4 + 4) = 1;
                uVar21 = 0;
LAB_0014be6c:
                *(undefined1 *)((long)&plVar25[6].next + uVar28 + 4) = uVar21;
              }
              plVar25 = plVar18[5].next;
            }
          }
          bVar1 = local_258->msg_addr_len;
          piVar24 = &acs[0].current;
          uVar16 = 0xffffffffffffffff;
          sVar26 = local_250;
          for (uVar28 = 0; bVar1 != uVar28; uVar28 = uVar28 + 1) {
            uVar29 = *piVar24 + piVar24[-1];
            uVar7 = uVar28;
            if ((int)(uint)sVar26 <= *piVar24 + piVar24[-1] ||
                0xfe < (int)(*(int *)last_addr -
                            ((_rfc5444_internal_addr_compress_session *)(piVar24 + -3))->ptr->index)
               ) {
              uVar29 = (uint)sVar26;
              uVar7 = uVar16;
            }
            uVar16 = uVar7 & 0xffffffff;
            piVar24 = piVar24 + 6;
            sVar26 = (size_t)uVar29;
          }
          if ((int)uVar16 == -1) goto LAB_0014bf5c;
          for (lVar32 = 0; (ulong)bVar1 * 0x18 - lVar32 != 0; lVar32 = lVar32 + 0x18) {
            piVar24 = (int *)((long)&acs[0].total + lVar32);
            *piVar24 = *piVar24 + *(int *)((long)&acs[0].current + lVar32);
          }
          if (*(char *)((long)&plVar23[9].prev + 1) == '\0') {
            *(undefined1 *)((long)&plVar23[9].prev + 1) = 1;
            iVar13 = iVar13 + (*(byte *)&plVar23[9].prev ^ 1);
          }
          plVar23 = plVar23->next;
          bVar33 = false;
          msg = local_268;
        } while( true );
      }
      current_list.prev = current_list.next;
      _finalize_message_fragment(writer,msg,&current_list,true,useIf,param);
      writer->_state = RFC5444_WRITER_NONE;
      _rfc5444_writer_free_addresses(writer,msg);
    }
    else {
LAB_0014c03b:
      writer->_state = RFC5444_WRITER_NONE;
      writer->msg_addr_len = '\0';
    }
  }
  return RFC5444_OKAY;
code_r0x0014bda6:
  if (*(char *)&plVar19[5].next == '\0') {
    uVar29 = (uint)uVar4 * *(int *)((long)&plVar6[2].next + uVar28 * 4 + 4);
LAB_0014bdb3:
    iVar14 = iVar14 + uVar29;
  }
  goto LAB_0014bd58;
LAB_0014bf5c:
  if (iVar13 == 0) {
    local_258->_state = RFC5444_WRITER_NONE;
    _rfc5444_writer_free_addresses(local_258,local_268);
    return RFC5444_MTU_TOO_SMALL;
  }
  plVar18 = plVar23[1].next;
  plVar19 = plVar23[1].prev;
  plVar19->next = plVar18;
  plVar18->prev = plVar19;
  plVar23[1].next = (list_entity *)0x0;
  plVar23[1].prev = (list_entity *)0x0;
  local_248 = 0;
  _close_addrblock(acs,local_258,local_1c8,0);
  msg = local_268;
  _finalize_message_fragment(writer_00,local_268,&current_list,false,useIf,param);
  plVar23 = (list_entity *)(local_208 + 3);
  last_addr = prVar9;
  goto LAB_0014ba90;
}

Assistant:

enum rfc5444_result
rfc5444_writer_create_message(
  struct rfc5444_writer *writer, uint8_t msgid, uint8_t addr_len, rfc5444_writer_targetselector useIf, void *param)
{
  struct rfc5444_writer_message *msg;
  struct rfc5444_writer_content_provider *prv;
  struct list_entity *ptr1;
  struct rfc5444_writer_address *addr;
  struct rfc5444_writer_address *first_addr;
  struct rfc5444_writer_address *first_processed, *last_processed;
  struct rfc5444_writer_tlvtype *tlvtype;
  struct rfc5444_writer_target *target;
  struct list_entity current_list;

  struct rfc5444_writer_postprocessor *processor;
  size_t processor_preallocation;

  struct _rfc5444_internal_addr_compress_session acs[RFC5444_MAX_ADDRLEN];
  int best_size, best_head, same_prefixlen;
  int i, idx, non_mandatory;
  bool first;
  bool not_fragmented;
  size_t max_msg_size;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* do nothing if no target is defined */
  if (list_is_empty(&writer->_targets)) {
    return RFC5444_OKAY;
  }

  /* find message create instance for the requested message */
  msg = avl_find_element(&writer->_msgcreators, &msgid, msg, _msgcreator_node);
  if (msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  /*
   * test if we need target specific messages
   * and this is not the single_if selector
   */
  if (!msg->target_specific) {
    /* not target specific */
    writer->msg_target = NULL;
  }
  else if (useIf == rfc5444_writer_singletarget_selector) {
    /* target specific, but single_if selector is used */
    writer->msg_target = param;
  }
  else {
    /* target specific, but generic selector is used */
    enum rfc5444_result result;

    list_for_each_element(&writer->_targets, target, _target_node) {
      /* check if we should send over this target */
      if (!useIf(writer, target, param)) {
        continue;
      }

      /* create an unique message by recursive call */
      result = rfc5444_writer_create_message(writer, msgid, addr_len, rfc5444_writer_singletarget_selector, target);
      if (result != RFC5444_OKAY) {
        return result;
      }
    }
    return RFC5444_OKAY;
  }

  /* set address length */
  writer->msg_addr_len = addr_len;

  /*
   * initialize packet buffers for all interfaces if necessary
   * and calculate message MTU
   */

  /* loop over post-processors */
  processor_preallocation = 0;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, msg->type)) {
      processor_preallocation += processor->allocate_space;
    }
  }
  max_msg_size = writer->msg_size;
  list_for_each_element(&writer->_targets, target, _target_node) {
    size_t interface_msg_mtu;

    /* check if we should send over this target */
    if (!useIf(writer, target, param)) {
      continue;
    }

    /* start packet if necessary */
    if (target->_is_flushed) {
      _rfc5444_writer_begin_packet(writer, target);
    }

    interface_msg_mtu = target->packet_size - processor_preallocation -
                        (target->_pkt.header + target->_pkt.added + target->_pkt.allocated);
    if (interface_msg_mtu < max_msg_size) {
      max_msg_size = interface_msg_mtu;
    }
  }

  /* initialize message tlvdata */
  _rfc5444_tlv_writer_init(&writer->_msg, max_msg_size, writer->msg_size);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_HEADER;
#endif
  /* let the message creator write the message header */
  rfc5444_writer_set_msg_header(writer, msg, false, false, false, false);
  if (msg->addMessageHeader) {
    if (msg->addMessageHeader(writer, msg)) {
      /* message handler does not want this message */
#if WRITER_STATE_MACHINE == true
      writer->_state = RFC5444_WRITER_NONE;
#endif
      writer->msg_addr_len = 0;
      return RFC5444_OKAY;
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_MSGTLV;
#endif

  /* call content providers for message TLVs */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addMessageTLVs) {
      prv->addMessageTLVs(writer);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
#endif
  /* call content providers for addresses */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addAddresses) {
      prv->addAddresses(writer);
    }
  }

  /* join mandatory and normal address list */
  list_merge(&msg->_addr_head, &msg->_non_mandatory_addr_head);

  /* initialize list of current addresses */
  list_init_head(&current_list);
  not_fragmented = true;

  /* no addresses ? */
  if (list_is_empty(&msg->_addr_head)) {
    _finalize_message_fragment(writer, msg, &current_list, true, useIf, param);
#if WRITER_STATE_MACHINE == true
    writer->_state = RFC5444_WRITER_NONE;
#endif
    _rfc5444_writer_free_addresses(writer, msg);
    return RFC5444_OKAY;
  }

  /* start address compression */
  first = true;
  addr = first_addr = list_first_element(&msg->_addr_head, addr, _addr_list_node);

  same_prefixlen = 0;

  first_processed = NULL;
  last_processed = NULL;

  max_msg_size -= writer->_msg.header;
  max_msg_size -= writer->_msg.allocated;
  max_msg_size -= writer->_msg.added;

  /* loop through addresses */
  idx = 0;
  non_mandatory = 0;
  ptr1 = msg->_addr_head.next;
  while (ptr1 != &msg->_addr_head) {
    addr = container_of(ptr1, struct rfc5444_writer_address, _addr_list_node);
    if (addr->_done && !addr->_mandatory_addr) {
      ptr1 = ptr1->next;
      continue;
    }

    if (first) {
      /* clear message specific tlvtype information for address compression */
      list_for_each_element(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear generic tlvtype information for address compression */
      list_for_each_element(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear address compression session */
      memset(acs, 0, sizeof(acs));
      same_prefixlen = 1;

      first_processed = addr;
    }

    addr->index = idx++;
    list_add_tail(&current_list, &addr->_addr_fragment_node);

    /* update session with address */
    same_prefixlen = _compress_address(acs, writer, &current_list, same_prefixlen);
    first = false;

    /* look for best current compression */
    best_head = -1;
    best_size = max_msg_size + 1;
    for (i = 0; i < writer->msg_addr_len; i++) {
      int size = acs[i].total + acs[i].current;
      int count = addr->index - acs[i].ptr->index;

      /* a block of 255 addresses have an index difference of 254 */
      if (size < best_size && count <= 254) {
        best_head = i;
        best_size = size;
      }
    }

    /* fragmentation necessary ? */
    if (best_head == -1) {
      if (non_mandatory == 0) {
        /* the mandatory addresses plus one non-mandatory do not fit into a block! */
#if WRITER_STATE_MACHINE == true
        writer->_state = RFC5444_WRITER_NONE;
#endif
        _rfc5444_writer_free_addresses(writer, msg);
        return RFC5444_MTU_TOO_SMALL;
      }
      not_fragmented = false;

      /* one address too many */
      list_remove(&addr->_addr_fragment_node);

      _close_addrblock(acs, writer, last_processed, 0);
#ifdef DEBUG_OUTPUT
      printf("Finalize with head length: %d\n", last_processed->_block_headlen);
#endif
      /* write message fragment */
      _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);

      /* reset loop */
      list_init_head(&current_list);
      ptr1 = &first_processed->_addr_list_node;
      first = true;

      /* continue without stepping forward */
      continue;
    }
    else {
      /* add cost for this address to total costs */
      for (i = 0; i < writer->msg_addr_len; i++) {
        acs[i].total += acs[i].current;

#if DEBUG_CLEANUP == true
        acs[i].current = 0;
#endif
      }
      last_processed = addr;

      if (!addr->_done) {
        addr->_done = true;

        if (!addr->_mandatory_addr) {
          non_mandatory++;
        }
      }
    }

    ptr1 = ptr1->next;
  }

  if (last_processed) {
    _close_addrblock(acs, writer, last_processed, 0);

    /* write message fragment */
    _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);
  }

  /* free storage of addresses and address-tlvs */
  _rfc5444_writer_free_addresses(writer, msg);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif
  writer->msg_addr_len = 0;

  return RFC5444_OKAY;
}